

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O2

void __thiscall xLearn::Trainer::show_average_metric(Trainer *this)

{
  pointer pMVar1;
  undefined1 auVar2 [16];
  size_t i;
  long lVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 in_XMM2 [16];
  string local_50;
  undefined8 local_30 [4];
  
  pMVar1 = (this->metric_info_).
           super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar5 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar4 = ZEXT1664(ZEXT816(0) << 0x40);
  lVar3 = 0;
  while( true ) {
    if ((long)(this->metric_info_).
              super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar1 >> 3 == lVar3) break;
    if (this->metric_ != (Metric *)0x0) {
      auVar4 = ZEXT464((uint)(auVar4._0_4_ + pMVar1[lVar3].metric_val));
    }
    auVar5 = ZEXT464((uint)(auVar5._0_4_ + pMVar1[lVar3].loss_val));
    lVar3 = lVar3 + 1;
  }
  (*this->loss_->_vptr_Loss[8])(local_30);
  auVar2 = vcvtusi2ss_avx512f(in_XMM2,(long)(this->metric_info_).
                                            super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->metric_info_).
                                            super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  StringPrintf_abi_cxx11_
            (&local_50,"Average %s: %.6f",(double)(auVar5._0_4_ / auVar2._0_4_),local_30[0]);
  Color::print_info(&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)local_30);
  if (this->metric_ != (Metric *)0x0) {
    (*this->metric_->_vptr_Metric[5])(local_30);
    auVar2 = vcvtusi2ss_avx512f(in_XMM2,(long)(this->metric_info_).
                                              super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->metric_info_).
                                              super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3);
    StringPrintf_abi_cxx11_
              (&local_50,"Average %s: %.6f",(double)(auVar4._0_4_ / auVar2._0_4_),local_30[0]);
    Color::print_info(&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void Trainer::show_average_metric() {
  real_t loss = 0;
  real_t metric = 0;
  for (size_t i = 0; i < metric_info_.size(); ++i) {
    loss += metric_info_[i].loss_val;
    if (metric_ != nullptr) {
      metric += metric_info_[i].metric_val;
    }
  }
  Color::print_info(
    StringPrintf("Average %s: %.6f", 
    loss_->loss_type().c_str(), 
    loss / metric_info_.size())
  );
  if (metric_ != nullptr) {
    Color::print_info(
      StringPrintf("Average %s: %.6f", 
      metric_->metric_type().c_str(),
       metric / metric_info_.size())
    );
  }
}